

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicationFactory.cpp
# Opt level: O1

Application * __thiscall
ApplicationFactory::make(Application *__return_storage_ptr__,ApplicationFactory *this)

{
  ApplicationFactory *context_00;
  unique_ptr<solitaire::events::interfaces::EventsProcessor,_std::default_delete<solitaire::events::interfaces::EventsProcessor>_>
  eventsProcessor;
  unique_ptr<solitaire::graphics::interfaces::Renderer,_std::default_delete<solitaire::graphics::interfaces::Renderer>_>
  renderer;
  unique_ptr<solitaire::interfaces::Context,_std::default_delete<solitaire::interfaces::Context>_>
  context;
  _Head_base<0UL,_solitaire::time::interfaces::FPSLimiter_*,_false> local_50;
  _Head_base<0UL,_solitaire::graphics::interfaces::Renderer_*,_false> local_48;
  _Head_base<0UL,_solitaire::events::interfaces::EventsProcessor_*,_false> local_40;
  _Head_base<0UL,_solitaire::interfaces::Context_*,_false> local_38;
  EventsProcessor *local_30;
  Renderer *local_28;
  Context *local_20;
  
  context_00 = this;
  makeContext((ApplicationFactory *)&local_20);
  makeEventsProcessor((ApplicationFactory *)&local_30,(Context *)context_00);
  makeRenderer((ApplicationFactory *)&local_28,(Context *)this);
  local_38._M_head_impl = local_20;
  local_20 = (Context *)0x0;
  local_40._M_head_impl = local_30;
  local_30 = (EventsProcessor *)0x0;
  local_48._M_head_impl = local_28;
  local_28 = (Renderer *)0x0;
  makeFPSLimiter((ApplicationFactory *)&local_50);
  solitaire::Application::Application
            (__return_storage_ptr__,
             (unique_ptr<solitaire::interfaces::Context,_std::default_delete<solitaire::interfaces::Context>_>
              *)&local_38,
             (unique_ptr<solitaire::events::interfaces::EventsProcessor,_std::default_delete<solitaire::events::interfaces::EventsProcessor>_>
              *)&local_40,
             (unique_ptr<solitaire::graphics::interfaces::Renderer,_std::default_delete<solitaire::graphics::interfaces::Renderer>_>
              *)&local_48,
             (unique_ptr<solitaire::time::interfaces::FPSLimiter,_std::default_delete<solitaire::time::interfaces::FPSLimiter>_>
              *)&local_50);
  if (local_50._M_head_impl != (FPSLimiter *)0x0) {
    (*(local_50._M_head_impl)->_vptr_FPSLimiter[1])();
  }
  local_50._M_head_impl = (FPSLimiter *)0x0;
  if (local_48._M_head_impl != (Renderer *)0x0) {
    (*(local_48._M_head_impl)->_vptr_Renderer[1])();
  }
  local_48._M_head_impl = (Renderer *)0x0;
  if (local_40._M_head_impl != (EventsProcessor *)0x0) {
    (*(local_40._M_head_impl)->_vptr_EventsProcessor[1])();
  }
  local_40._M_head_impl = (EventsProcessor *)0x0;
  if (local_38._M_head_impl != (Context *)0x0) {
    (*(local_38._M_head_impl)->_vptr_Context[1])();
  }
  return __return_storage_ptr__;
}

Assistant:

Application ApplicationFactory::make() const {
    auto context = makeContext();
    auto eventsProcessor = makeEventsProcessor(*context);
    auto renderer = makeRenderer(*context);

    return Application {std::move(context), std::move(eventsProcessor),
                        std::move(renderer), makeFPSLimiter()};
}